

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Uri.cpp
# Opt level: O2

string * Uri::Uri::referenceResolution(string *__return_storage_ptr__,string *scheme,string *path)

{
  bool bVar1;
  allocator<char> local_19;
  
  bVar1 = std::operator==(scheme,"https");
  if (((bVar1) || (bVar1 = std::operator==(scheme,"http"), bVar1)) ||
     (bVar1 = std::operator==(scheme,"file"), bVar1)) {
    if (path->_M_string_length == 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"/",&local_19);
      return __return_storage_ptr__;
    }
    if (*(path->_M_dataplus)._M_p != '/') {
      std::operator+(__return_storage_ptr__,"/",path);
      return __return_storage_ptr__;
    }
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)path);
  return __return_storage_ptr__;
}

Assistant:

string Uri::referenceResolution (const string &scheme, const string &path) {
    if (scheme == "https" || scheme == "http" || scheme == "file") {
        if (path.empty()) {
            return "/";
        }

        if (path[0] != '/') {
            return "/" + path;
        }
    }

    return path;
}